

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::stem(path *__return_storage_ptr__,path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  long **pplVar6;
  impl_string_type fn;
  path local_58;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  filename(&local_58,this);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,local_58._path._M_dataplus._M_p,
             local_58._path._M_dataplus._M_p + local_58._path._M_string_length);
  paVar2 = &local_58._path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._path._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._path._M_dataplus._M_p,
                    CONCAT71(local_58._path.field_2._M_allocated_capacity._1_7_,
                             local_58._path.field_2._M_local_buf[0]) + 1);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar3 != 0) {
      lVar4 = std::__cxx11::string::rfind((char)&local_38,0x2e);
      if (1 < lVar4 + 1U) {
        pplVar6 = &local_38;
        std::__cxx11::string::substr((ulong)&local_58,(ulong)pplVar6);
        paVar1 = &(__return_storage_ptr__->_path).field_2;
        (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._path._M_dataplus._M_p == paVar2) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_58._path.field_2._M_allocated_capacity._1_7_,
                        local_58._path.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) =
               local_58._path.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_path)._M_dataplus._M_p = local_58._path._M_dataplus._M_p;
          (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
               CONCAT71(local_58._path.field_2._M_allocated_capacity._1_7_,
                        local_58._path.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->_path)._M_string_length = local_58._path._M_string_length;
        local_58._path._M_string_length = 0;
        local_58._path.field_2._M_local_buf[0] = '\0';
        local_58._path._M_dataplus._M_p = (pointer)paVar2;
        postprocess_path_with_format(__return_storage_ptr__,(format)pplVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._path._M_dataplus._M_p != paVar2) {
          operator_delete(local_58._path._M_dataplus._M_p,
                          CONCAT71(local_58._path.field_2._M_allocated_capacity._1_7_,
                                   local_58._path.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_001d639d;
      }
    }
  }
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  plVar5 = local_38;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,local_38,local_30 + (long)local_38);
  postprocess_path_with_format(__return_storage_ptr__,(format)plVar5);
LAB_001d639d:
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::stem() const
{
    impl_string_type fn = filename().native();
    if (fn != "." && fn != "..") {
        impl_string_type::size_type pos = fn.rfind('.');
        if (pos != impl_string_type::npos && pos > 0) {
            return path{fn.substr(0, pos), native_format};
        }
    }
    return path{fn, native_format};
}